

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_xpcall(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  int errcode;
  TRef tmp;
  TValue argv1;
  TValue argv0;
  int errcode_00;
  lua_State *L;
  undefined8 local_138;
  long *local_130;
  long local_128;
  undefined1 *local_120;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 *local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  char *local_90;
  undefined8 *local_88;
  undefined8 local_80;
  char *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 *local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 *local_28;
  undefined8 local_20;
  char *local_18;
  undefined8 *local_10;
  undefined8 local_8;
  
  if (1 < *(uint *)(in_RDI + 0x94)) {
    errcode_00 = **(int **)(in_RDI + 0x88);
    **(undefined4 **)(in_RDI + 0x88) = *(undefined4 *)(*(long *)(in_RDI + 0x88) + 4);
    *(int *)(*(long *)(in_RDI + 0x88) + 4) = errcode_00;
    local_98 = *(undefined8 *)(in_RDI + 0x68);
    local_a8 = (undefined8 *)*in_RSI;
    local_a0 = &local_138;
    local_138 = *local_a8;
    local_90 = "copy of dead GC object";
    local_b0 = *(undefined8 *)(in_RDI + 0x68);
    local_c0 = (undefined8 *)(*in_RSI + 8);
    local_b8 = &stack0xfffffffffffffec0;
    L = (lua_State *)*local_c0;
    local_78 = "copy of dead GC object";
    local_c8 = *(undefined8 *)(in_RDI + 0x68);
    local_d0 = (undefined8 *)*in_RSI;
    local_d8 = &stack0xfffffffffffffec0;
    *local_d0 = L;
    local_60 = "copy of dead GC object";
    local_e0 = *(undefined8 *)(in_RDI + 0x68);
    local_e8 = (undefined8 *)(*in_RSI + 8);
    local_f0 = &local_138;
    *local_e8 = local_138;
    local_48 = "copy of dead GC object";
    local_130 = in_RSI;
    local_128 = in_RDI;
    local_88 = local_a0;
    local_80 = local_98;
    local_70 = local_b8;
    local_68 = local_b0;
    local_58 = local_d0;
    local_50 = local_c8;
    local_40 = local_e8;
    local_38 = local_e0;
    iVar1 = lj_vm_cpcall(*(undefined8 *)(in_RDI + 0x68),0,in_RDI,recff_xpcall_cp);
    local_f8 = *(undefined8 *)(local_128 + 0x68);
    local_100 = (undefined8 *)*local_130;
    local_108 = &local_138;
    *local_100 = local_138;
    local_30 = "copy of dead GC object";
    local_110 = *(undefined8 *)(local_128 + 0x68);
    local_118 = (undefined8 *)(*local_130 + 8);
    local_120 = &stack0xfffffffffffffec0;
    *local_118 = L;
    local_18 = "copy of dead GC object";
    if (iVar1 != 0) {
      local_28 = local_100;
      local_20 = local_f8;
      local_10 = local_118;
      local_8 = local_110;
      lj_err_throw(L,errcode_00);
    }
    local_130[1] = -1;
    *(undefined1 *)(local_128 + 0x9d) = 1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_xpcall(jit_State *J, RecordFFData *rd)
{
  if (J->maxslot >= 2) {
    TValue argv0, argv1;
    TRef tmp;
    int errcode;
    /* Swap function and traceback. */
    tmp = J->base[0]; J->base[0] = J->base[1]; J->base[1] = tmp;
    copyTV(J->L, &argv0, &rd->argv[0]);
    copyTV(J->L, &argv1, &rd->argv[1]);
    copyTV(J->L, &rd->argv[0], &argv1);
    copyTV(J->L, &rd->argv[1], &argv0);
#if LJ_FR2
    /* Shift function arguments up. */
    memmove(J->base + 2, J->base + 1, sizeof(TRef) * (J->maxslot-1));
#endif
    /* Need to protect lj_record_call because it may throw. */
    errcode = lj_vm_cpcall(J->L, NULL, J, recff_xpcall_cp);
    /* Always undo Lua stack swap to avoid confusing the interpreter. */
    copyTV(J->L, &rd->argv[0], &argv0);
    copyTV(J->L, &rd->argv[1], &argv1);
    if (errcode)
      lj_err_throw(J->L, errcode);  /* Propagate errors. */
    rd->nres = -1;  /* Pending call. */
    J->needsnap = 1;  /* Start catching on-trace errors. */
  }  /* else: Interpreter will throw. */
}